

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O2

int AF_AActor_A_XScream(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  bool bVar1;
  int iVar2;
  FSoundID *sound_id;
  AActor *ent;
  char *__assertion;
  FSoundID local_10;
  FSoundID local_c;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_004018a2;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    ent = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (ent != (AActor *)0x0) {
        bVar1 = DObject::IsKindOf((DObject *)ent,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_004018a2;
        }
        goto LAB_00401844;
      }
    }
    else if (ent != (AActor *)0x0) goto LAB_00401892;
    ent = (AActor *)0x0;
LAB_00401844:
    if (ent->player == (player_t *)0x0) {
      iVar2 = S_FindSound("misc/gibbed");
      sound_id = &local_10;
    }
    else {
      iVar2 = S_FindSound("*gibbed");
      sound_id = &local_c;
    }
    sound_id->ID = iVar2;
    S_Sound(ent,2,sound_id,1.0,1.0);
    return 0;
  }
LAB_00401892:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_004018a2:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0xc75,"int AF_AActor_A_XScream(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_XScream)
{
	PARAM_SELF_PROLOGUE(AActor);
	if (self->player)
		S_Sound (self, CHAN_VOICE, "*gibbed", 1, ATTN_NORM);
	else
		S_Sound (self, CHAN_VOICE, "misc/gibbed", 1, ATTN_NORM);
	return 0;
}